

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodeUpdateVisibleFlagAndInactiveChilds(ImGuiDockNode *node)

{
  ImGuiWindow *window_00;
  ImGuiContext *pIVar1;
  uint uVar2;
  ImGuiWindow **ppIVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ImGuiDockNodeFlags node_flags;
  bool remove;
  bool node_was_active;
  ImGuiWindow *window;
  int window_n;
  ImGuiContext *g;
  ImGuiDockNode *node_local;
  
  pIVar1 = GImGui;
  bVar4 = true;
  if ((node->ParentNode != (ImGuiDockNode *)0x0) &&
     (bVar4 = true, node->ParentNode->ChildNodes[0] != node)) {
    bVar4 = node->ParentNode->ChildNodes[1] == node;
  }
  if (bVar4) {
    if (node->ParentNode != (ImGuiDockNode *)0x0) {
      node->SharedFlags = node->ParentNode->SharedFlags;
    }
    if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
      DockNodeUpdateVisibleFlagAndInactiveChilds(node->ChildNodes[0]);
    }
    if (node->ChildNodes[1] != (ImGuiDockNode *)0x0) {
      DockNodeUpdateVisibleFlagAndInactiveChilds(node->ChildNodes[1]);
    }
    window._4_4_ = 0;
    while( true ) {
      if ((node->Windows).Size <= window._4_4_) {
        uVar2 = ImGuiDockNode::GetMergedFlags(node);
        if ((((((byte)node->field_0xba >> 1 & 1) != 0) && ((node->Windows).Size == 1)) &&
            ((uVar2 & 0x40) != 0)) && (bVar4 = ImGuiDockNode::IsHiddenTabBar(node), !bVar4)) {
          node->field_0xba = node->field_0xba & 0xfb | 4;
        }
        node->field_0xba = node->field_0xba & 0xfd;
        if (((((byte)node->field_0xba >> 2 & 1) != 0) && (node->VisibleWindow != (ImGuiWindow *)0x0)
            ) && (((node->VisibleWindow->WindowClass).DockNodeFlagsOverrideSet & 0x2000U) != 0)) {
          node->field_0xba = node->field_0xba & 0xfb;
        }
        if ((node->Windows).Size < 2) {
          if (((byte)node->field_0xba >> 2 & 1) != 0) {
            node->LocalFlags = node->LocalFlags ^ 0x2000;
          }
        }
        else {
          node->LocalFlags = node->LocalFlags & 0xffffdfff;
        }
        node->field_0xba = node->field_0xba & 0xfb;
        DockNodeUpdateVisibleFlag(node);
        return;
      }
      ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&node->Windows,window._4_4_);
      window_00 = *ppIVar3;
      if (window_00->DockNode != node) break;
      bVar5 = node->LastFrameActive + 1 == pIVar1->FrameCount;
      bVar4 = false;
      if (bVar5) {
        bVar4 = window_00->LastFrameActive + 1 < pIVar1->FrameCount;
      }
      bVar6 = false;
      if (((bVar5) &&
          (((*(ushort *)&node->field_0xb8 >> 0xe & 1) != 0 ||
           (bVar6 = false, node->WantCloseTabId == window_00->ID)))) &&
         (bVar6 = false, (window_00->HasCloseButton & 1U) != 0)) {
        bVar6 = (window_00->Flags & 0x100000U) == 0;
      }
      if ((bVar4 || bVar6) || ((byte)window_00->field_0x492 >> 2 & 1) != 0) {
        window_00->field_0x492 = window_00->field_0x492 & 0xfb;
        if (((node->Windows).Size == 1) && (bVar4 = ImGuiDockNode::IsCentralNode(node), !bVar4)) {
          DockNodeHideHostWindow(node);
          node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
          DockNodeRemoveWindow(node,window_00,node->ID);
          return;
        }
        DockNodeRemoveWindow(node,window_00,node->ID);
        window._4_4_ = window._4_4_ + -1;
      }
      else {
        node->LocalFlags =
             ((window_00->WindowClass).DockNodeFlagsOverrideClear ^ 0xffffffffU) & node->LocalFlags;
        node->LocalFlags = (window_00->WindowClass).DockNodeFlagsOverrideSet | node->LocalFlags;
      }
      window._4_4_ = window._4_4_ + 1;
    }
    __assert_fail("window->DockNode == node",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3221,"void ImGui::DockNodeUpdateVisibleFlagAndInactiveChilds(ImGuiDockNode *)")
    ;
  }
  __assert_fail("node->ParentNode == __null || node->ParentNode->ChildNodes[0] == node || node->ParentNode->ChildNodes[1] == node"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                ,0x320d,"void ImGui::DockNodeUpdateVisibleFlagAndInactiveChilds(ImGuiDockNode *)");
}

Assistant:

static void ImGui::DockNodeUpdateVisibleFlagAndInactiveChilds(ImGuiDockNode* node)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(node->ParentNode == NULL || node->ParentNode->ChildNodes[0] == node || node->ParentNode->ChildNodes[1] == node);

    // Inherit most flags
    if (node->ParentNode)
        node->SharedFlags = node->ParentNode->SharedFlags & ImGuiDockNodeFlags_SharedFlagsInheritMask_;

    // Recurse into children
    // There is the possibility that one of our child becoming empty will delete itself and moving its sibling contents into 'node'.
    // If 'node->ChildNode[0]' delete itself, then 'node->ChildNode[1]->Windows' will be moved into 'node'
    // If 'node->ChildNode[1]' delete itself, then 'node->ChildNode[0]->Windows' will be moved into 'node' and the "remove inactive windows" loop will have run twice on those windows (harmless)
    if (node->ChildNodes[0])
        DockNodeUpdateVisibleFlagAndInactiveChilds(node->ChildNodes[0]);
    if (node->ChildNodes[1])
        DockNodeUpdateVisibleFlagAndInactiveChilds(node->ChildNodes[1]);

    // Remove inactive windows
    // Merge node flags overrides stored in windows
    for (int window_n = 0; window_n < node->Windows.Size; window_n++)
    {
        ImGuiWindow* window = node->Windows[window_n];
        IM_ASSERT(window->DockNode == node);

        bool node_was_active = (node->LastFrameActive + 1 == g.FrameCount);
        bool remove = false;
        remove |= node_was_active && (window->LastFrameActive + 1 < g.FrameCount);
        remove |= node_was_active && (node->WantCloseAll || node->WantCloseTabId == window->ID) && window->HasCloseButton && !(window->Flags & ImGuiWindowFlags_UnsavedDocument);  // Submit all _expected_ closure from last frame
        remove |= (window->DockTabWantClose);
        if (remove)
        {
            window->DockTabWantClose = false;
            if (node->Windows.Size == 1 && !node->IsCentralNode())
            {
                DockNodeHideHostWindow(node);
                node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
                DockNodeRemoveWindow(node, window, node->ID); // Will delete the node so it'll be invalid on return
                return;
            }
            DockNodeRemoveWindow(node, window, node->ID);
            window_n--;
        }
        else
        {
            node->LocalFlags &= ~window->WindowClass.DockNodeFlagsOverrideClear;
            node->LocalFlags |= window->WindowClass.DockNodeFlagsOverrideSet;
        }
    }

    // Auto-hide tab bar option
    ImGuiDockNodeFlags node_flags = node->GetMergedFlags();
    if (node->WantHiddenTabBarUpdate && node->Windows.Size == 1 && (node_flags & ImGuiDockNodeFlags_AutoHideTabBar) && !node->IsHiddenTabBar())
        node->WantHiddenTabBarToggle = true;
    node->WantHiddenTabBarUpdate = false;

    // Cancel toggling if we know our tab bar is enforced to be hidden at all times
    if (node->WantHiddenTabBarToggle && node->VisibleWindow && (node->VisibleWindow->WindowClass.DockNodeFlagsOverrideSet & ImGuiDockNodeFlags_HiddenTabBar))
        node->WantHiddenTabBarToggle = false;

    // Apply toggles at a single point of the frame (here!)
    if (node->Windows.Size > 1)
        node->LocalFlags &= ~ImGuiDockNodeFlags_HiddenTabBar;
    else if (node->WantHiddenTabBarToggle)
        node->LocalFlags ^= ImGuiDockNodeFlags_HiddenTabBar;
    node->WantHiddenTabBarToggle = false;

    DockNodeUpdateVisibleFlag(node);
}